

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::resize
          (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *this,size_type n)

{
  pointer pfVar1;
  allocator_type *paVar2;
  size_t sVar3;
  allocator_type *paVar4;
  float *pfVar5;
  ulong in_RSI;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_RDI;
  size_type i_2;
  size_type i_1;
  size_type i;
  size_t num_transfer;
  size_t s;
  pointer new_end;
  float *new_buf;
  float *in_stack_ffffffffffffff98;
  float *__p;
  allocator_type *in_stack_ffffffffffffffa0;
  allocator_type *__a;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_stack_ffffffffffffffa8;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  paVar2 = (allocator_type *)
           choose_data(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  if (paVar2 == (allocator_type *)in_RDI->m_begin) {
    pfVar1 = in_RDI->m_begin;
    while (pfVar1 + in_RSI < in_RDI->m_end) {
      get_alloc(in_RDI);
      in_RDI->m_end = in_RDI->m_end + -1;
      std::allocator_traits<std::allocator<float>_>::destroy<float>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    while (in_RDI->m_end < pfVar1 + in_RSI) {
      get_alloc(in_RDI);
      in_RDI->m_end = in_RDI->m_end + 1;
      std::allocator_traits<std::allocator<float>_>::construct<float>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    sVar3 = size(in_RDI);
    local_48 = sVar3;
    if (in_RSI < sVar3) {
      local_48 = in_RSI;
    }
    for (local_38 = 0; local_38 < local_48; local_38 = local_38 + 1) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<float>>::construct<float,float>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(float *)0x186121);
    }
    for (local_40 = 0; local_40 < sVar3; local_40 = local_40 + 1) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<float>_>::destroy<float>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    for (; local_48 < in_RSI; local_48 = local_48 + 1) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<float>_>::construct<float>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    __a = paVar2;
    paVar4 = (allocator_type *)static_begin_ptr(in_RDI);
    if (__a == paVar4) {
      in_RDI->m_capacity = 4;
    }
    else {
      __p = in_RDI->m_begin;
      pfVar5 = static_begin_ptr(in_RDI);
      if (__p != pfVar5) {
        get_alloc(in_RDI);
        std::allocator_traits<std::allocator<float>_>::deallocate(__a,__p,0x186233);
      }
      in_RDI->m_capacity = in_RDI->m_dynamic_capacity;
    }
    in_RDI->m_begin = (pointer)paVar2;
    in_RDI->m_end = (pointer)(paVar2 + in_RSI * 4);
  }
  return;
}

Assistant:

void resize(size_type n)
    {
        auto new_buf = choose_data(n);

        if (new_buf == m_begin)
        {
            // no special transfers needed

            auto new_end = m_begin + n;

            while (m_end > new_end)
            {
                atraits::destroy(get_alloc(), --m_end);
            }

            while (new_end > m_end)
            {
                atraits::construct(get_alloc(), m_end++);
            }
        }
        else
        {
            // we need to transfer the elements into the new buffer

            const auto s = size();
            const auto num_transfer = n < s ? n : s;

            for (size_type i = 0; i < num_transfer; ++i)
            {
                atraits::construct(get_alloc(), new_buf + i, std::move(*(m_begin + i)));
            }

            // free obsoletes
            for (size_type i = 0; i < s; ++i)
            {
                atraits::destroy(get_alloc(), m_begin + i);
            }

            // construct new elements
            for (size_type i = num_transfer; i < n; ++i)
            {
                atraits::construct(get_alloc(), new_buf + i);
            }

            if (new_buf == static_begin_ptr())
            {
                m_capacity = StaticCapacity;
            }
            else
            {
                if (m_begin != static_begin_ptr())
                {
                    // we've moved from dyn to dyn memory, so deallocate the old one
                    atraits::deallocate(get_alloc(), m_begin, m_capacity);
                }
                m_capacity = m_dynamic_capacity;
            }

            m_begin = new_buf;
            m_end = new_buf + n;
        }
    }